

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

Symbol __thiscall avro::parsing::Symbol::rootSymbol(Symbol *this,ProductionPtr *s)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  placeholder *ppVar3;
  any extraout_RDX;
  Symbol SVar4;
  _func_int **local_60;
  placeholder local_58;
  element_type *local_50;
  shared_count local_48 [2];
  shared_count local_38;
  
  boost::make_shared<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>();
  peVar1 = s->px;
  psVar2 = (s->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  local_38.pi_ = (sp_counted_base *)local_58._vptr_placeholder;
  if ((sp_counted_base *)local_58._vptr_placeholder != (sp_counted_base *)0x0) {
    LOCK();
    *(uint_least32_t *)(local_58._vptr_placeholder + 1) =
         *(uint_least32_t *)(local_58._vptr_placeholder + 1) + 1;
    UNLOCK();
  }
  this->kind_ = sRoot;
  local_50 = peVar1;
  local_48[0].pi_ = psVar2;
  ppVar3 = (placeholder *)operator_new(0x28);
  ppVar3->_vptr_placeholder = (_func_int **)&PTR__holder_001d0148;
  ppVar3[1]._vptr_placeholder = (_func_int **)peVar1;
  ppVar3[2]._vptr_placeholder = (_func_int **)psVar2;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  ppVar3[3]._vptr_placeholder = local_60;
  ppVar3[4]._vptr_placeholder = local_58._vptr_placeholder;
  if ((sp_counted_base *)local_58._vptr_placeholder != (sp_counted_base *)0x0) {
    LOCK();
    *(uint_least32_t *)(local_58._vptr_placeholder + 1) =
         *(uint_least32_t *)(local_58._vptr_placeholder + 1) + 1;
    UNLOCK();
  }
  (this->extra_).content = ppVar3;
  boost::detail::shared_count::~shared_count(&local_38);
  boost::detail::shared_count::~shared_count(local_48);
  boost::detail::shared_count::~shared_count((shared_count *)&local_58);
  SVar4.extra_.content = extraout_RDX.content;
  SVar4._0_8_ = this;
  return SVar4;
}

Assistant:

static Symbol rootSymbol(ProductionPtr& s)
    {
        return Symbol(Symbol::sRoot, RootInfo(s, boost::make_shared<Production>()));
    }